

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadGroupNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  XMLLoader *pXVar1;
  GroupNode *this_00;
  long *in_RDX;
  ulong uVar2;
  _Alloc_hider local_40;
  XMLLoader *local_38;
  
  local_38 = this;
  this_00 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,0);
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  if (*(long *)(*in_RDX + 0x88) != *(long *)(*in_RDX + 0x80)) {
    uVar2 = 0;
    do {
      loadNode((XMLLoader *)&stack0xffffffffffffffc0,xml);
      if ((long *)local_40._M_p != (long *)0x0) {
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
        ::push_back(&this_00->children,(value_type *)&stack0xffffffffffffffc0);
        if ((long *)local_40._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_40._M_p + 0x18))();
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3));
  }
  pXVar1 = local_38;
  (local_38->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)pXVar1;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadGroupNode(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=0; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));
    return group.cast<SceneGraph::Node>();
  }